

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O0

fio_str_info_s *
fiobj_data_read2ch_str(fio_str_info_s *__return_storage_ptr__,FIOBJ io,uint8_t token)

{
  uint8_t *lim;
  uint8_t *pos;
  FIOBJ FStack_10;
  uint8_t token_local;
  FIOBJ io_local;
  
  pos._7_1_ = token;
  FStack_10 = io;
  if (*(long *)(io + 0x28) == *(long *)(io + 0x20)) {
    memset(__return_storage_ptr__,0,0x18);
  }
  else {
    lim = (uint8_t *)(*(long *)(io + 8) + *(long *)(io + 0x28));
    swallow_ch(&lim,(uint8_t *)(*(long *)(io + 8) + *(long *)(io + 0x20)),token);
    __return_storage_ptr__->capa = 0;
    __return_storage_ptr__->len =
         (size_t)(lim + (-*(long *)(FStack_10 + 0x28) - *(long *)(FStack_10 + 8)));
    __return_storage_ptr__->data = (char *)(*(long *)(FStack_10 + 8) + *(long *)(FStack_10 + 0x28));
    *(long *)(FStack_10 + 0x28) = (long)lim - *(long *)(FStack_10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

static fio_str_info_s fiobj_data_read2ch_str(FIOBJ io, uint8_t token) {
  if (obj2io(io)->pos == obj2io(io)->len) /* EOF */
    return (fio_str_info_s){.data = NULL, .len = 0};

  uint8_t *pos = obj2io(io)->buffer + obj2io(io)->pos;
  uint8_t *lim = obj2io(io)->buffer + obj2io(io)->len;
  swallow_ch(&pos, lim, token);
  fio_str_info_s ret = (fio_str_info_s){
      .data = (char *)obj2io(io)->buffer + obj2io(io)->pos,
      .len = (uintptr_t)(pos - obj2io(io)->buffer) - obj2io(io)->pos,
  };
  obj2io(io)->pos = (uintptr_t)(pos - obj2io(io)->buffer);
  return ret;
}